

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

Vec_Ptr_t * Aig_ManSupports(Aig_Man_t *pMan)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  Part_Man_t *p;
  Vec_Ptr_t *p_00;
  int *piVar5;
  Vec_Int_t *p_01;
  Part_One_t *pPVar6;
  undefined8 *puVar7;
  uint i;
  uint uVar8;
  Vec_Int_t *p1;
  Vec_Int_t *p2;
  long lVar9;
  
  for (lVar9 = 0; lVar9 < pMan->vCis->nSize; lVar9 = lVar9 + 1) {
    plVar4 = (long *)Vec_PtrEntry(pMan->vCis,(int)lVar9);
    *plVar4 = lVar9;
  }
  for (lVar9 = 0; lVar9 < pMan->vCos->nSize; lVar9 = lVar9 + 1) {
    plVar4 = (long *)Vec_PtrEntry(pMan->vCos,(int)lVar9);
    *plVar4 = lVar9;
  }
  p_01 = (Vec_Int_t *)&DAT_00000040;
  p = Part_ManStart(0x100000,0x40);
  p_00 = Vec_PtrAlloc(pMan->nObjs[3]);
  Aig_ManCleanData(pMan);
  i = 0;
  do {
    iVar3 = (int)p_01;
    if (pMan->vObjs->nSize <= (int)i) {
      Part_ManStop(p);
      Vec_VecSort((Vec_Vec_t *)p_00,iVar3);
      for (iVar3 = 0; iVar3 < pMan->vCis->nSize; iVar3 = iVar3 + 1) {
        puVar7 = (undefined8 *)Vec_PtrEntry(pMan->vCis,iVar3);
        *puVar7 = 0;
      }
      for (iVar3 = 0; iVar3 < pMan->vCos->nSize; iVar3 = iVar3 + 1) {
        puVar7 = (undefined8 *)Vec_PtrEntry(pMan->vCos,iVar3);
        *puVar7 = 0;
      }
      return p_00;
    }
    p_01 = (Vec_Int_t *)(ulong)i;
    piVar5 = (int *)Vec_PtrEntry(pMan->vObjs,i);
    if (piVar5 != (int *)0x0) {
      uVar8 = (uint)*(undefined8 *)(piVar5 + 6);
      if ((uVar8 & 7) - 7 < 0xfffffffe) {
        uVar2 = uVar8 & 7;
        if (uVar2 == 2) {
          if (0x3f < uVar8) {
            pPVar6 = Part_ManFetchEntry(p,1,uVar8 >> 6);
            iVar3 = *piVar5;
            iVar1 = pPVar6->nOuts;
            uVar8 = iVar1 + 1;
            p_01 = (Vec_Int_t *)(ulong)uVar8;
            pPVar6->nOuts = uVar8;
            (&pPVar6[1].nRefs)[iVar1] = iVar3;
LAB_005782f5:
            *(Part_One_t **)(piVar5 + 10) = pPVar6;
          }
        }
        else {
          if (uVar2 == 3) {
            p2 = *(Vec_Int_t **)((*(ulong *)(piVar5 + 2) & 0xfffffffffffffffe) + 0x28);
            p_01 = Part_ManTransferEntry((Part_One_t *)p2);
            Vec_IntPush(p_01,*piVar5);
            Vec_PtrPush(p_00,p_01);
            iVar3 = p2->nCap;
            if (iVar3 < 1) {
              __assert_fail("pPart0->nRefs > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                            ,0x13a,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
            }
            goto LAB_00578290;
          }
          if (((ulong)piVar5 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
          }
          if (uVar2 != 1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                          ,0x14f,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
          }
          if (0x3f < uVar8) {
            p_01 = (Vec_Int_t *)0x0;
            pPVar6 = Part_ManFetchEntry(p,0,uVar8 >> 6);
            goto LAB_005782f5;
          }
        }
      }
      else {
        p1 = *(Vec_Int_t **)((*(ulong *)(piVar5 + 2) & 0xfffffffffffffffe) + 0x28);
        p2 = *(Vec_Int_t **)((*(ulong *)(piVar5 + 4) & 0xfffffffffffffffe) + 0x28);
        p_01 = p1;
        pPVar6 = Part_ManMergeEntry(p,(Part_One_t *)p1,(Part_One_t *)p2,uVar8 >> 6);
        *(Part_One_t **)(piVar5 + 10) = pPVar6;
        if (p1->nCap < 1) {
          __assert_fail("pPart0->nRefs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                        ,0x12a,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
        }
        iVar3 = p1->nCap + -1;
        p1->nCap = iVar3;
        if (iVar3 == 0) {
          Part_ManRecycleEntry(p,(Part_One_t *)p1);
          p_01 = p1;
        }
        iVar3 = p2->nCap;
        if (iVar3 < 1) {
          __assert_fail("pPart1->nRefs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                        ,0x12d,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
        }
LAB_00578290:
        p2->nCap = iVar3 + -1;
        if (iVar3 + -1 == 0) {
          Part_ManRecycleEntry(p,(Part_One_t *)p2);
          p_01 = p2;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Aig_ManSupports( Aig_Man_t * pMan )
{
    Vec_Ptr_t * vSupports;
    Vec_Int_t * vSupp;
    Part_Man_t * p;
    Part_One_t * pPart0, * pPart1;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    // set the number of PIs/POs
    Aig_ManForEachCi( pMan, pObj, i )
        pObj->pNext = (Aig_Obj_t *)(long)i;
    Aig_ManForEachCo( pMan, pObj, i )
        pObj->pNext = (Aig_Obj_t *)(long)i;
    // start the support computation manager
    p = Part_ManStart( 1 << 20, 1 << 6 );
    // consider objects in the topological order
    vSupports = Vec_PtrAlloc( Aig_ManCoNum(pMan) );
    Aig_ManCleanData(pMan);
    Aig_ManForEachObj( pMan, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
        {
            pPart0 = (Part_One_t *)Aig_ObjFanin0(pObj)->pData;
            pPart1 = (Part_One_t *)Aig_ObjFanin1(pObj)->pData;
            pObj->pData = Part_ManMergeEntry( p, pPart0, pPart1, pObj->nRefs );
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Part_ManRecycleEntry( p, pPart0 );
            assert( pPart1->nRefs > 0 );
            if ( --pPart1->nRefs == 0 )
                Part_ManRecycleEntry( p, pPart1 );
            if ( ((Part_One_t *)pObj->pData)->nOuts <= 16 )
                Counter++;
            continue;
        }
        if ( Aig_ObjIsCo(pObj) )
        {
            pPart0 = (Part_One_t *)Aig_ObjFanin0(pObj)->pData;
            vSupp = Part_ManTransferEntry(pPart0);
            Vec_IntPush( vSupp, (int)(long)pObj->pNext );
            Vec_PtrPush( vSupports, vSupp );
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Part_ManRecycleEntry( p, pPart0 );
            continue;
        }
        if ( Aig_ObjIsCi(pObj) )
        {
            if ( pObj->nRefs )
            {
                pPart0 = Part_ManFetchEntry( p, 1, pObj->nRefs );
                pPart0->pOuts[ pPart0->nOuts++ ] = (int)(long)pObj->pNext;
                pObj->pData = pPart0;
            }
            continue;
        }
        if ( Aig_ObjIsConst1(pObj) )
        {
            if ( pObj->nRefs )
                pObj->pData = Part_ManFetchEntry( p, 0, pObj->nRefs );
            continue;
        }
        assert( 0 );
    }
//printf( "Memory usage = %d MB.\n", Vec_PtrSize(p->vMemory) * p->nChunkSize / (1<<20) );
    Part_ManStop( p );
    // sort supports by size
    Vec_VecSort( (Vec_Vec_t *)vSupports, 1 );
    // clear the number of PIs/POs
    Aig_ManForEachCi( pMan, pObj, i )
        pObj->pNext = NULL;
    Aig_ManForEachCo( pMan, pObj, i )
        pObj->pNext = NULL;
/*
    Aig_ManForEachCo( pMan, pObj, i )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vSupports, i) ) );
    printf( "\n" );
*/
//    printf( "%d \n", Counter );
    return vSupports;
}